

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O2

void __thiscall
FIntermissionActionTextscreen::FIntermissionActionTextscreen(FIntermissionActionTextscreen *this)

{
  FIntermissionAction::FIntermissionAction(&this->super_FIntermissionAction);
  (this->super_FIntermissionAction)._vptr_FIntermissionAction =
       (_func_int **)&PTR__FIntermissionActionTextscreen_006e6a70;
  (this->mText).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_FIntermissionAction).mSize = 0x80;
  (this->super_FIntermissionAction).mClass = DIntermissionScreenText::RegistrationInfo.MyClass;
  this->mTextColor = CR_UNTRANSLATED;
  this->mTextDelay = 10;
  this->mTextSpeed = 2;
  this->mTextX = -1;
  this->mTextY = -1;
  return;
}

Assistant:

FIntermissionActionTextscreen::FIntermissionActionTextscreen()
{
	mSize = sizeof(FIntermissionActionTextscreen);
	mClass = RUNTIME_CLASS(DIntermissionScreenText);
	mTextSpeed = 2;
	mTextX = -1;	// use gameinfo defaults
	mTextY = -1;
	mTextColor = CR_UNTRANSLATED;
	mTextDelay = 10;
}